

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::SwizzleTestBase<3U,_32849U>::SwizzleTestBase
          (SwizzleTestBase<3U,_32849U> *this)

{
  initializer_list<unsigned_char> __l;
  reference pvVar1;
  allocator_type *in_RDI;
  allocator_type *this_00;
  uint32_t i;
  ktx_uint32_t in_stack_00000048;
  ktx_uint32_t in_stack_0000004c;
  ktx_uint32_t in_stack_00000050;
  createFlags in_stack_00000054;
  WriterTestHelper<unsigned_char,_3U,_32849U> *in_stack_00000058;
  vector<unsigned_char,_std::allocator<unsigned_char>_> defaultColor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> color;
  Test *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  value_type vVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30 [2];
  
  testing::Test::Test(in_stack_ffffffffffffff70);
  *(undefined ***)in_RDI = &PTR__SwizzleTestBase_00219198;
  this_00 = in_RDI + 0x10;
  WriterTestHelper<unsigned_char,_3U,_32849U>::WriterTestHelper
            ((WriterTestHelper<unsigned_char,_3U,_32849U> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,
                               CONCAT15(in_stack_ffffffffffffffa5,
                                        CONCAT14(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                )))));
  *(undefined4 *)(in_RDI + 0x150) = 0x10;
  *(undefined4 *)(in_RDI + 0x154) = 0x10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x153e33);
  uVar4 = 1;
  uVar5 = 2;
  uVar6 = 3;
  uVar7 = 4;
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffa3;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x153e69);
  __l._M_array._4_4_ = in_stack_ffffffffffffff9c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff98;
  __l._M_len._0_4_ = in_stack_ffffffffffffffa0;
  __l._M_len._4_1_ = uVar4;
  __l._M_len._5_1_ = uVar5;
  __l._M_len._6_1_ = uVar6;
  __l._M_len._7_1_ = uVar7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,__l,in_RDI);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x153e8e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_01,CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  for (uVar3 = 0; uVar3 < 3; uVar3 = uVar3 + 1) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&local_48,(ulong)uVar3);
    vVar2 = *pvVar1;
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_30,(ulong)uVar3);
    *pvVar1 = vVar2;
  }
  WriterTestHelper<unsigned_char,_3U,_32849U>::resize
            (in_stack_00000058,in_stack_00000054,in_stack_00000050,in_stack_0000004c,
             in_stack_00000048,i,
             (ktx_uint32_t)
             defaultColor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (ktx_uint32_t)
             color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

SwizzleTestBase() {
        std::vector<GLubyte> color;
        // Use swizzle enumerator values for easy checking of result.
        std::vector<GLubyte> defaultColor = { R, G, B, A };
        color.resize(num_components);
        for (uint32_t i = 0; i < num_components; i++) {
            color[i] = defaultColor[i];
        }
        helper.resize(createFlagBits::eNone, 1, 1, 2, width, height, 1, &color);
    }